

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::ByteCodeWriter::PatchJumpOffset<short>
          (ByteCodeWriter *this,
          List<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *jumpOffset,byte *byteBuffer,uint byteCount)

{
  long lVar1;
  long lVar2;
  anon_class_32_4_9ba205d3 local_48;
  
  if (0 < (jumpOffset->
          super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>)
          .count) {
    lVar1 = 0;
    lVar2 = 0;
    local_48.byteCount = byteCount;
    local_48.byteBuffer = byteBuffer;
    local_48.this = this;
    local_48.jumpOffset = jumpOffset;
    do {
      PatchJumpOffset<short>::anon_class_32_4_9ba205d3::operator()
                (&local_48,(int)lVar2,
                 (JumpInfo *)
                 ((long)&((jumpOffset->
                          super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>
                          ).buffer)->labelId + lVar1));
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 8;
    } while (lVar2 < (jumpOffset->
                     super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>
                     ).count);
  }
  return;
}

Assistant:

void ByteCodeWriter::PatchJumpOffset(JsUtil::List<JumpInfo, ArenaAllocator> * jumpOffset, byte * byteBuffer, uint byteCount)
    {
        jumpOffset->Map([=](int index, JumpInfo& jumpInfo)
        {
            //
            // Read "labelID" stored at the offset within the byte-code.
            //
            uint jumpByteOffset = jumpInfo.patchOffset;
            AssertMsg(jumpByteOffset < byteCount - sizeof(T),
                "Must have valid jump site within byte-code to back-patch");

            unaligned T * pnBackPatch = reinterpret_cast<unaligned T *>(&byteBuffer[jumpByteOffset]);

            ByteCodeLabel labelID = jumpInfo.labelId;
            CheckLabel(labelID);

            uint offsetToEndOfLayoutByteSize = *pnBackPatch;
            Assert(offsetToEndOfLayoutByteSize < 0x20);

            //
            // Use "labelID" to lookup the destination offset, replacing the temporary data in the
            // byte-code.
            //

            uint labelByteOffset = m_labelOffsets->Item(labelID);
            AssertMsg(labelByteOffset != UINT_MAX, "ERROR: Destination labels must be marked before closing");

            int relativeJumpOffset = labelByteOffset - jumpByteOffset - offsetToEndOfLayoutByteSize;
#ifdef BYTECODE_BRANCH_ISLAND
            Assert(!useBranchIsland || (jumpOffset != m_jumpOffsets || (relativeJumpOffset < GetBranchLimit() && relativeJumpOffset >= -GetBranchLimit())));
#endif
            Assert((T)relativeJumpOffset == relativeJumpOffset);
            *pnBackPatch = (T)relativeJumpOffset;
        });
    }